

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

size_t ma_mp3_dr_callback__read(void *pUserData,void *pBufferOut,size_t bytesToRead)

{
  size_t bytesRead;
  size_t local_10;
  
  (**(code **)((long)pUserData + 0x48))
            (*(undefined8 *)((long)pUserData + 0x60),pBufferOut,bytesToRead,&local_10);
  return local_10;
}

Assistant:

static size_t ma_mp3_dr_callback__read(void* pUserData, void* pBufferOut, size_t bytesToRead)
{
    ma_mp3* pMP3 = (ma_mp3*)pUserData;
    ma_result result;
    size_t bytesRead;

    MA_ASSERT(pMP3 != NULL);

    result = pMP3->onRead(pMP3->pReadSeekTellUserData, pBufferOut, bytesToRead, &bytesRead);
    (void)result;

    return bytesRead;
}